

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

OPJ_BOOL opj_jp2_start_compress
                   (opj_jp2_t *jp2,opj_stream_private_t *stream,opj_image_t *p_image,
                   opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  
  if (jp2 == (opj_jp2_t *)0x0) {
    __assert_fail("jp2 != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x9a6,
                  "OPJ_BOOL opj_jp2_start_compress(opj_jp2_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                 );
  }
  if (stream != (opj_stream_private_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x9a8,
                    "OPJ_BOOL opj_jp2_start_compress(opj_jp2_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
                   );
    }
    OVar1 = opj_procedure_list_add_procedure
                      (jp2->m_validation_list,opj_jp2_default_validation,p_manager);
    if ((((OVar1 != 0) &&
         (OVar1 = opj_jp2_exec(jp2,jp2->m_validation_list,stream,p_manager), OVar1 != 0)) &&
        (OVar1 = opj_procedure_list_add_procedure(jp2->m_procedure_list,opj_jp2_write_jp,p_manager),
        OVar1 != 0)) &&
       ((OVar1 = opj_procedure_list_add_procedure
                           (jp2->m_procedure_list,opj_jp2_write_ftyp,p_manager), OVar1 != 0 &&
        (OVar1 = opj_procedure_list_add_procedure
                           (jp2->m_procedure_list,opj_jp2_write_jp2h,p_manager), OVar1 != 0)))) {
      if ((jp2->jpip_on != 0) &&
         (OVar1 = opj_procedure_list_add_procedure
                            (jp2->m_procedure_list,opj_jpip_skip_iptr,p_manager), OVar1 == 0)) {
        return 0;
      }
      OVar1 = opj_procedure_list_add_procedure(jp2->m_procedure_list,opj_jp2_skip_jp2c,p_manager);
      if ((OVar1 != 0) &&
         (OVar1 = opj_jp2_exec(jp2,jp2->m_procedure_list,stream,p_manager), OVar1 != 0)) {
        OVar1 = opj_j2k_start_compress(jp2->j2k,stream,p_image,p_manager);
        return OVar1;
      }
    }
    return 0;
  }
  __assert_fail("stream != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x9a7,
                "OPJ_BOOL opj_jp2_start_compress(opj_jp2_t *, opj_stream_private_t *, opj_image_t *, opj_event_mgr_t *)"
               );
}

Assistant:

OPJ_BOOL opj_jp2_start_compress(opj_jp2_t *jp2,
                                opj_stream_private_t *stream,
                                opj_image_t * p_image,
                                opj_event_mgr_t * p_manager
                               )
{
    /* preconditions */
    assert(jp2 != 00);
    assert(stream != 00);
    assert(p_manager != 00);

    /* customization of the validation */
    if (! opj_jp2_setup_encoding_validation(jp2, p_manager)) {
        return OPJ_FALSE;
    }

    /* validation of the parameters codec */
    if (! opj_jp2_exec(jp2, jp2->m_validation_list, stream, p_manager)) {
        return OPJ_FALSE;
    }

    /* customization of the encoding */
    if (! opj_jp2_setup_header_writing(jp2, p_manager)) {
        return OPJ_FALSE;
    }

    /* write header */
    if (! opj_jp2_exec(jp2, jp2->m_procedure_list, stream, p_manager)) {
        return OPJ_FALSE;
    }

    return opj_j2k_start_compress(jp2->j2k, stream, p_image, p_manager);
}